

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,true,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  sel_t sVar8;
  long lVar9;
  int64_t *piVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    lVar14 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar14 = 0;
    uVar11 = 0;
    uVar13 = 0;
    do {
      uVar16 = uVar11;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar18 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar18 = count;
        }
LAB_0041678c:
        if (uVar11 < uVar18) {
          psVar3 = sel->sel_vector;
          iVar1 = ldata->days;
          lVar6 = ldata->micros;
          lVar5 = lVar6 / 86400000000 + (long)iVar1;
          iVar12 = ldata->months;
          psVar4 = false_sel->sel_vector;
          piVar10 = &rdata[uVar11].micros;
          do {
            uVar16 = uVar11;
            if (psVar3 != (sel_t *)0x0) {
              uVar16 = (ulong)psVar3[uVar11];
            }
            lVar9 = *piVar10;
            if (iVar1 == *(int32_t *)((long)piVar10 + -4) &&
                iVar12 == ((interval_t *)(piVar10 + -1))->months) {
              uVar15 = 1;
              lVar17 = (long)iVar1;
              if (lVar6 != lVar9) goto LAB_00416885;
            }
            else {
              lVar17 = (long)*(int32_t *)((long)piVar10 + -4);
LAB_00416885:
              lVar17 = lVar17 + lVar9 / 86400000000;
              if (lVar5 / 0x1e + (long)iVar12 ==
                  (long)((interval_t *)(piVar10 + -1))->months + lVar17 / 0x1e) {
                uVar15 = 0;
                if (lVar5 % 0x1e == lVar17 % 0x1e) {
                  uVar15 = (ulong)(lVar6 % 86400000000 == lVar9 % 86400000000);
                }
              }
              else {
                uVar15 = 0;
              }
            }
            psVar4[lVar14] = (sel_t)uVar16;
            lVar14 = uVar15 + lVar14;
            uVar11 = uVar11 + 1;
            piVar10 = piVar10 + 2;
            uVar16 = uVar18;
          } while (uVar18 != uVar11);
        }
      }
      else {
        uVar15 = puVar2[uVar13];
        uVar18 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar18 = count;
        }
        if (uVar15 == 0xffffffffffffffff) goto LAB_0041678c;
        if (uVar15 == 0) {
          uVar16 = uVar18;
          if (uVar11 < uVar18) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar8 = (sel_t)uVar11;
              if (psVar3 != (sel_t *)0x0) {
                sVar8 = psVar3[uVar11];
              }
              psVar4[lVar14] = sVar8;
              lVar14 = lVar14 + 1;
              uVar11 = uVar11 + 1;
            } while (uVar18 != uVar11);
          }
        }
        else if (uVar11 < uVar18) {
          psVar3 = sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          piVar10 = &rdata[uVar11].micros;
          uVar7 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar8 = (int)uVar11 + (int)uVar7;
            }
            else {
              sVar8 = psVar3[uVar11 + uVar7];
            }
            uVar16 = 1;
            if ((uVar15 >> (uVar7 & 0x3f) & 1) != 0) {
              iVar1 = ldata->days;
              lVar5 = ldata->micros;
              lVar6 = *piVar10;
              iVar12 = *(int32_t *)((long)piVar10 + -4);
              if ((*(int32_t *)((long)piVar10 + -4) != iVar1 ||
                   ((interval_t *)(piVar10 + -1))->months != ldata->months) ||
                 (iVar12 = iVar1, lVar5 != lVar6)) {
                lVar9 = (long)iVar1 + lVar5 / 86400000000;
                lVar17 = (long)iVar12 + lVar6 / 86400000000;
                if ((long)ldata->months + lVar9 / 0x1e ==
                    (long)((interval_t *)(piVar10 + -1))->months + lVar17 / 0x1e) {
                  uVar16 = 0;
                  if (lVar9 % 0x1e == lVar17 % 0x1e) {
                    uVar16 = (ulong)(lVar5 % 86400000000 == lVar6 % 86400000000);
                  }
                }
                else {
                  uVar16 = 0;
                }
              }
            }
            psVar4[lVar14] = sVar8;
            lVar14 = uVar16 + lVar14;
            uVar7 = uVar7 + 1;
            piVar10 = piVar10 + 2;
            uVar16 = uVar18;
          } while (uVar18 - uVar11 != uVar7);
        }
      }
      uVar11 = uVar16;
      uVar13 = uVar13 + 1;
    } while (uVar13 != count + 0x3f >> 6);
  }
  return count - lVar14;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}